

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

uint8_t * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBinary
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
          ValueLength *length)

{
  byte *pbVar1;
  uint8_t *puVar2;
  Exception *this_00;
  
  pbVar1 = *(byte **)this;
  if ((*pbVar1 & 0xf8) == 0xc0) {
    puVar2 = (uint8_t *)
             (*(code *)(&DAT_00112010 +
                       *(int *)(&DAT_00112010 + (ulong)((*pbVar1 + 1 & 0xf) - 1) * 4)))
                       (&DAT_00112010 +
                        *(int *)(&DAT_00112010 + (ulong)((*pbVar1 + 1 & 0xf) - 1) * 4),length,pbVar1
                        ,pbVar1 + 1);
    return puVar2;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InvalidValueType,"Expecting type Binary");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }